

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void * __thiscall jpgd::jpeg_decoder::alloc(jpeg_decoder *this,size_t nSize,bool zero)

{
  mem_block *pmVar1;
  ulong __n;
  uint local_58;
  size_t local_50;
  mem_block *b_1;
  mem_block *pmStack_30;
  int capacity;
  mem_block *b;
  char *rv;
  bool zero_local;
  size_t nSize_local;
  jpeg_decoder *this_local;
  
  local_50 = nSize;
  if (nSize < 2) {
    local_50 = 1;
  }
  __n = local_50 + 3 & 0xfffffffffffffffc;
  b = (mem_block *)0x0;
  pmStack_30 = this->m_pMem_blocks;
  do {
    if (pmStack_30 == (mem_block *)0x0) {
LAB_00183054:
      if (b == (mem_block *)0x0) {
        if ((__n + 0x7ff & 0xfffffffffffff800) < 0x7f00) {
          local_58 = 0x7f00;
        }
        else {
          local_58 = (int)__n + 0x7ffU & 0xfffff800;
        }
        pmVar1 = (mem_block *)jpgd_malloc((long)(int)local_58 + 0x20);
        if (pmVar1 == (mem_block *)0x0) {
          stop_decoding(this,JPGD_NOTENOUGHMEM);
        }
        pmVar1->m_pNext = this->m_pMem_blocks;
        this->m_pMem_blocks = pmVar1;
        pmVar1->m_used_count = __n;
        pmVar1->m_size = (long)(int)local_58;
        b = (mem_block *)pmVar1->m_data;
      }
      if (zero) {
        memset(b,0,__n);
      }
      return b;
    }
    if (pmStack_30->m_used_count + __n <= pmStack_30->m_size) {
      b = (mem_block *)(pmStack_30->m_data + pmStack_30->m_used_count);
      pmStack_30->m_used_count = __n + pmStack_30->m_used_count;
      goto LAB_00183054;
    }
    pmStack_30 = pmStack_30->m_pNext;
  } while( true );
}

Assistant:

void* jpeg_decoder::alloc(size_t nSize, bool zero)
	{
		nSize = (JPGD_MAX(nSize, 1) + 3) & ~3;
		char* rv = nullptr;
		for (mem_block* b = m_pMem_blocks; b; b = b->m_pNext)
		{
			if ((b->m_used_count + nSize) <= b->m_size)
			{
				rv = b->m_data + b->m_used_count;
				b->m_used_count += nSize;
				break;
			}
		}
		if (!rv)
		{
			int capacity = JPGD_MAX(32768 - 256, (nSize + 2047) & ~2047);
			mem_block* b = (mem_block*)jpgd_malloc(sizeof(mem_block) + capacity);
			if (!b)
			{
				stop_decoding(JPGD_NOTENOUGHMEM);
			}

			b->m_pNext = m_pMem_blocks;
			m_pMem_blocks = b;
			b->m_used_count = nSize;
			b->m_size = capacity;
			rv = b->m_data;
		}
		if (zero) memset(rv, 0, nSize);
		return rv;
	}